

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cc
# Opt level: O3

Status __thiscall
google::protobuf::json_internal::anon_unknown_4::
WriteRepeated<google::protobuf::json_internal::UnparseProto3Type>
          (anon_unknown_4 *this,JsonWriter *writer,
          Msg<google::protobuf::json_internal::UnparseProto3Type> *msg,
          Field<google::protobuf::json_internal::UnparseProto3Type> field)

{
  Message **ppMVar1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  Field *desc;
  bool bVar5;
  MessageType MVar6;
  uintptr_t extraout_RAX;
  uintptr_t extraout_RAX_00;
  undefined1 *extraout_RAX_01;
  undefined1 *extraout_RAX_02;
  undefined1 *extraout_RAX_03;
  undefined1 *extraout_RAX_04;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 aVar7;
  undefined1 *extraout_RAX_05;
  undefined1 *extraout_RAX_06;
  long lVar8;
  undefined1 *extraout_RAX_07;
  undefined1 *extraout_RAX_08;
  undefined1 *extraout_RAX_09;
  undefined1 *extraout_RAX_10;
  undefined1 *puVar9;
  uintptr_t extraout_RAX_11;
  undefined8 uVar10;
  Status *_status;
  size_t idx;
  char *bytes;
  double dVar11;
  undefined1 auVar12 [16];
  string_view sVar13;
  string_view name;
  StatusOr<long> x;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 local_100;
  float local_f8;
  undefined4 uStack_f4;
  char *pcStack_f0;
  Msg<google::protobuf::json_internal::UnparseProto3Type> *local_d0;
  string *local_c8;
  undefined1 local_c0 [40];
  Field local_98;
  _Tuple_impl<0UL,_unsigned_long> local_68;
  _Tuple_impl<0UL,_long> local_60;
  double local_58;
  double dStack_50;
  Quoted<std::basic_string_view<char,_std::char_traits<char>_>_> local_40;
  
  io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"[",1);
  writer->indent_ = writer->indent_ + 1;
  local_d0 = msg;
  local_c0._32_8_ = UntypedMessage::Count(msg,(field->raw_->field_0)._impl_.number_);
  if (local_c0._32_8_ == 0) {
    writer->indent_ = writer->indent_ + -1;
  }
  else {
    local_c8 = &writer->scratch_buf_;
    bVar4 = true;
    idx = 0;
    do {
      sVar13 = Proto3Type::FieldTypeName(field);
      name._M_str = sVar13._M_str;
      name._M_len = (size_t)name._M_str;
      MVar6 = ClassifyMessage((json_internal *)sVar13._M_len,name);
      if (MVar6 == kValue) {
        ResolverPool::Field::MessageType(&local_98);
        desc = local_98.raw_;
        *(ResolverPool **)this = local_98.pool_;
        if (((ulong)local_98.pool_ & 1) == 0) {
          LOCK();
          *(int *)&((local_98.pool_)->messages_).
                   super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>
               = *(int *)&((local_98.pool_)->messages_).
                          super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>
                 + 1;
          UNLOCK();
        }
        if (local_98.pool_ != (ResolverPool *)0x1) {
          absl::lts_20240722::internal_statusor::
          StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>::
          ~StatusOrData((StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>
                         *)&local_98);
          if (*(long *)this != 1) {
            return (Status)extraout_RAX;
          }
          goto LAB_002d0a69;
        }
        UnparseProto3Type::GetMessage((UnparseProto3Type *)&local_100.status_,field,local_d0,idx);
        *(anon_union_8_1_1246618d_for_StatusOrData<int>_1 *)this = local_100;
        if (((ulong)local_100 & 1) == 0) {
          LOCK();
          *(int *)local_100 = *(int *)local_100 + 1;
          UNLOCK();
        }
        if (local_100 == (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) {
          bVar5 = IsEmpty<google::protobuf::json_internal::UnparseProto3Type>
                            ((Msg<google::protobuf::json_internal::UnparseProto3Type> *)
                             CONCAT44(uStack_f4,local_f8),
                             (Desc<google::protobuf::json_internal::UnparseProto3Type> *)desc);
          *(undefined8 *)this = 1;
        }
        else {
          bVar5 = false;
        }
        absl::lts_20240722::internal_statusor::
        StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>::~StatusOrData
                  ((StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*> *)
                   &local_100.status_);
        absl::lts_20240722::internal_statusor::
        StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>::~StatusOrData
                  ((StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*> *)
                   &local_98);
        if (*(long *)this != 1) {
          return (Status)extraout_RAX_00;
        }
        if (bVar5 == false) goto LAB_002d0a69;
        goto LAB_002d10c2;
      }
LAB_002d0a69:
      if (bVar4) {
        bVar4 = false;
      }
      else {
        io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,",",1);
      }
      JsonWriter::NewLine(writer);
      iVar2 = (field->raw_->field_0)._impl_.kind_;
      switch(iVar2) {
      case 1:
        UnparseProto3Type::GetDouble((UnparseProto3Type *)&local_100.status_,field,local_d0,idx);
        *(anon_union_8_1_1246618d_for_StatusOrData<int>_1 *)this = local_100;
        aVar7 = local_100;
        if (((ulong)local_100 & 1) == 0) {
          LOCK();
          *(int *)local_100 = *(int *)local_100 + 1;
          UNLOCK();
          aVar7.status_.rep_ = *(Status *)this;
        }
        if (aVar7 != (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) {
          absl::lts_20240722::internal_statusor::StatusOrData<double>::~StatusOrData
                    ((StatusOrData<double> *)&local_100.status_);
          puVar9 = extraout_RAX_09;
          break;
        }
        if (local_100 == (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) {
          JsonWriter::Write(writer,(double)CONCAT44(uStack_f4,local_f8));
          absl::lts_20240722::internal_statusor::StatusOrData<double>::~StatusOrData
                    ((StatusOrData<double> *)&local_100.status_);
          goto LAB_002d1091;
        }
LAB_002d1179:
        absl::lts_20240722::internal_statusor::Helper::Crash(&local_100.status_);
        goto LAB_002d1183;
      case 2:
        UnparseProto3Type::GetFloat((UnparseProto3Type *)&local_100.status_,field,local_d0,idx);
        *(anon_union_8_1_1246618d_for_StatusOrData<int>_1 *)this = local_100;
        aVar7 = local_100;
        if (((ulong)local_100 & 1) == 0) {
          LOCK();
          *(int *)local_100 = *(int *)local_100 + 1;
          UNLOCK();
          aVar7.status_.rep_ = *(Status *)this;
        }
        if (aVar7 == (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) {
          if (local_100 == (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) {
            JsonWriter::Write(writer,local_f8);
            absl::lts_20240722::internal_statusor::StatusOrData<float>::~StatusOrData
                      ((StatusOrData<float> *)&local_100.status_);
            goto LAB_002d1091;
          }
LAB_002d116f:
          absl::lts_20240722::internal_statusor::Helper::Crash(&local_100.status_);
          goto LAB_002d1179;
        }
        absl::lts_20240722::internal_statusor::StatusOrData<float>::~StatusOrData
                  ((StatusOrData<float> *)&local_100.status_);
        puVar9 = extraout_RAX_10;
        break;
      case 3:
      case 0x10:
      case 0x12:
        UnparseProto3Type::GetInt64((UnparseProto3Type *)&local_100.status_,field,local_d0,idx);
        *(anon_union_8_1_1246618d_for_StatusOrData<int>_1 *)this = local_100;
        aVar7 = local_100;
        if (((ulong)local_100 & 1) == 0) {
          LOCK();
          *(int *)local_100 = *(int *)local_100 + 1;
          UNLOCK();
          aVar7.status_.rep_ = *(Status *)this;
        }
        if (aVar7 != (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) {
          absl::lts_20240722::internal_statusor::StatusOrData<long>::~StatusOrData
                    ((StatusOrData<long> *)&local_100.status_);
          puVar9 = extraout_RAX_02;
          break;
        }
        if ((writer->options_).unquote_int64_if_possible == true) {
          if (local_100 != (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) goto LAB_002d1129;
          bVar5 = RoundTripsThroughDouble<long>(CONCAT44(uStack_f4,local_f8));
          if (!bVar5) goto LAB_002d0d31;
          if (local_100 != (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) goto LAB_002d1129;
          JsonWriter::Write(writer,CONCAT44(uStack_f4,local_f8));
        }
        else {
LAB_002d0d31:
          if (local_100 != (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) {
LAB_002d1129:
            absl::lts_20240722::internal_statusor::Helper::Crash(&local_100.status_);
            goto LAB_002d1133;
          }
          local_60.super__Head_base<0UL,_long,_false>._M_head_impl._4_4_ = uStack_f4;
          local_60.super__Head_base<0UL,_long,_false>._M_head_impl._0_4_ = local_f8;
          JsonWriter::Write<long>(writer,(Quoted<long> *)&local_60);
        }
        absl::lts_20240722::internal_statusor::StatusOrData<long>::~StatusOrData
                  ((StatusOrData<long> *)&local_100.status_);
        goto LAB_002d1091;
      case 4:
      case 6:
        UnparseProto3Type::GetUInt64((UnparseProto3Type *)&local_100.status_,field,local_d0,idx);
        *(anon_union_8_1_1246618d_for_StatusOrData<int>_1 *)this = local_100;
        aVar7 = local_100;
        if (((ulong)local_100 & 1) == 0) {
          LOCK();
          *(int *)local_100 = *(int *)local_100 + 1;
          UNLOCK();
          aVar7.status_.rep_ = *(Status *)this;
        }
        if (aVar7 == (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) {
          if ((writer->options_).unquote_int64_if_possible == true) {
            if (local_100 == (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) {
              uVar3 = CONCAT44(uStack_f4,local_f8);
              auVar12._8_4_ = uStack_f4;
              auVar12._0_8_ = uVar3;
              auVar12._12_4_ = 0x45300000;
              dStack_50 = auVar12._8_8_ - 1.9342813113834067e+25;
              local_58 = dStack_50 + ((double)CONCAT44(0x43300000,local_f8) - 4503599627370496.0);
              dVar11 = ldexp(1.0,0x40);
              if (uVar3 != ((long)(local_58 - 9.223372036854776e+18) & (long)local_58 >> 0x3f |
                           (long)local_58) || dVar11 <= local_58) goto LAB_002d1060;
              if (local_100 != (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1)
              goto LAB_002d113d;
              JsonWriter::Write(writer,CONCAT44(uStack_f4,local_f8));
              goto LAB_002d1087;
            }
          }
          else {
LAB_002d1060:
            if (local_100 == (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) {
              local_68.super__Head_base<0UL,_unsigned_long,_false>._M_head_impl._4_4_ = uStack_f4;
              local_68.super__Head_base<0UL,_unsigned_long,_false>._M_head_impl._0_4_ = local_f8;
              JsonWriter::Write<unsigned_long>(writer,(Quoted<unsigned_long> *)&local_68);
LAB_002d1087:
              absl::lts_20240722::internal_statusor::StatusOrData<unsigned_long>::~StatusOrData
                        ((StatusOrData<unsigned_long> *)&local_100.status_);
              goto LAB_002d1091;
            }
          }
LAB_002d113d:
          absl::lts_20240722::internal_statusor::Helper::Crash(&local_100.status_);
LAB_002d1147:
          absl::lts_20240722::internal_statusor::Helper::Crash(&local_100.status_);
LAB_002d1151:
          absl::lts_20240722::internal_statusor::Helper::Crash(&local_100.status_);
LAB_002d115b:
          absl::lts_20240722::internal_statusor::Helper::Crash(&local_100.status_);
LAB_002d1165:
          absl::lts_20240722::internal_statusor::Helper::Crash(&local_100.status_);
          goto LAB_002d116f;
        }
        absl::lts_20240722::internal_statusor::StatusOrData<unsigned_long>::~StatusOrData
                  ((StatusOrData<unsigned_long> *)&local_100.status_);
        puVar9 = extraout_RAX_03;
        break;
      case 5:
      case 0xf:
      case 0x11:
        UnparseProto3Type::GetInt32((UnparseProto3Type *)&local_100.status_,field,local_d0,idx);
        *(anon_union_8_1_1246618d_for_StatusOrData<int>_1 *)this = local_100;
        aVar7 = local_100;
        if (((ulong)local_100 & 1) == 0) {
          LOCK();
          *(int *)local_100 = *(int *)local_100 + 1;
          UNLOCK();
          aVar7.status_.rep_ = *(Status *)this;
        }
        if (aVar7 == (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) {
          if (local_100 == (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) {
            JsonWriter::Write(writer,(int32_t)local_f8);
            goto LAB_002d0f42;
          }
LAB_002d1133:
          absl::lts_20240722::internal_statusor::Helper::Crash(&local_100.status_);
          goto LAB_002d113d;
        }
LAB_002d0f51:
        absl::lts_20240722::internal_statusor::StatusOrData<int>::~StatusOrData
                  ((StatusOrData<int> *)&local_100.status_);
        puVar9 = extraout_RAX_04;
        break;
      case 7:
      case 0xd:
        UnparseProto3Type::GetUInt32((UnparseProto3Type *)&local_100.status_,field,local_d0,idx);
        *(anon_union_8_1_1246618d_for_StatusOrData<int>_1 *)this = local_100;
        aVar7 = local_100;
        if (((ulong)local_100 & 1) == 0) {
          LOCK();
          *(int *)local_100 = *(int *)local_100 + 1;
          UNLOCK();
          aVar7.status_.rep_ = *(Status *)this;
        }
        if (aVar7 == (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) {
          if (local_100 == (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) {
            JsonWriter::Write(writer,(uint32_t)local_f8);
            absl::lts_20240722::internal_statusor::StatusOrData<unsigned_int>::~StatusOrData
                      ((StatusOrData<unsigned_int> *)&local_100.status_);
            goto LAB_002d1091;
          }
          goto LAB_002d1147;
        }
        absl::lts_20240722::internal_statusor::StatusOrData<unsigned_int>::~StatusOrData
                  ((StatusOrData<unsigned_int> *)&local_100.status_);
        puVar9 = extraout_RAX_06;
        break;
      case 8:
        UnparseProto3Type::GetBool((UnparseProto3Type *)&local_100.status_,field,local_d0,idx);
        *(anon_union_8_1_1246618d_for_StatusOrData<int>_1 *)this = local_100;
        aVar7 = local_100;
        if (((ulong)local_100 & 1) == 0) {
          LOCK();
          *(int *)local_100 = *(int *)local_100 + 1;
          UNLOCK();
          aVar7.status_.rep_ = *(Status *)this;
        }
        if (aVar7 == (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) {
          if (local_100 == (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) {
            bytes = "false";
            if ((ulong)local_f8._0_1_ != 0) {
              bytes = "true";
            }
            io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                      (&writer->sink_,bytes,(ulong)local_f8._0_1_ ^ 5);
            absl::lts_20240722::internal_statusor::StatusOrData<bool>::~StatusOrData
                      ((StatusOrData<bool> *)&local_100.status_);
            goto LAB_002d1091;
          }
          goto LAB_002d115b;
        }
        absl::lts_20240722::internal_statusor::StatusOrData<bool>::~StatusOrData
                  ((StatusOrData<bool> *)&local_100.status_);
        puVar9 = extraout_RAX_08;
        break;
      case 9:
        UnparseProto3Type::GetString
                  ((StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                   &local_100.status_,field,local_c8,local_d0,idx);
        *(anon_union_8_1_1246618d_for_StatusOrData<int>_1 *)this = local_100;
        aVar7 = local_100;
        if (((ulong)local_100 & 1) == 0) {
          LOCK();
          *(int *)local_100 = *(int *)local_100 + 1;
          UNLOCK();
          aVar7.status_.rep_ = *(Status *)this;
        }
        if (aVar7 == (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) {
          if (local_100 == (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) {
            local_40.value.
            super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
            super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
            _M_head_impl._M_len = CONCAT44(uStack_f4,local_f8);
            local_40.value.
            super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
            super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
            _M_head_impl._M_str = pcStack_f0;
            JsonWriter::Write<std::basic_string_view<char,std::char_traits<char>>>(writer,&local_40)
            ;
LAB_002d0fbd:
            absl::lts_20240722::internal_statusor::
            StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::~StatusOrData
                      ((StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                       &local_100.status_);
            goto LAB_002d1091;
          }
          goto LAB_002d1165;
        }
LAB_002d0fcc:
        absl::lts_20240722::internal_statusor::
        StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::~StatusOrData
                  ((StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                   &local_100.status_);
        puVar9 = extraout_RAX_05;
        break;
      case 10:
      case 0xb:
        UnparseProto3Type::GetMessage((UnparseProto3Type *)&local_100.status_,field,local_d0,idx);
        *(anon_union_8_1_1246618d_for_StatusOrData<int>_1 *)this = local_100;
        aVar7 = local_100;
        if (((ulong)local_100 & 1) == 0) {
          LOCK();
          *(int *)local_100 = *(int *)local_100 + 1;
          UNLOCK();
          aVar7.status_.rep_ = *(Status *)this;
        }
        if (aVar7 == (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) {
          if (local_100 != (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) goto LAB_002d1151;
          WriteMessage<google::protobuf::json_internal::UnparseProto3Type>
                    (this,writer,
                     (Msg<google::protobuf::json_internal::UnparseProto3Type> *)
                     CONCAT44(uStack_f4,local_f8),
                     ((Msg<google::protobuf::json_internal::UnparseProto3Type> *)
                     CONCAT44(uStack_f4,local_f8))->desc_,false);
        }
        absl::lts_20240722::internal_statusor::
        StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>::~StatusOrData
                  ((StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*> *)
                   &local_100.status_);
        puVar9 = extraout_RAX_01;
        break;
      case 0xc:
        UnparseProto3Type::GetString
                  ((StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                   &local_100.status_,field,local_c8,local_d0,idx);
        *(anon_union_8_1_1246618d_for_StatusOrData<int>_1 *)this = local_100;
        aVar7 = local_100;
        if (((ulong)local_100 & 1) == 0) {
          LOCK();
          *(int *)local_100 = *(int *)local_100 + 1;
          UNLOCK();
          aVar7.status_.rep_ = *(Status *)this;
        }
        if (aVar7 != (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) goto LAB_002d0fcc;
        if (local_100 == (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) {
          sVar13._M_len._4_4_ = uStack_f4;
          sVar13._M_len._0_4_ = local_f8;
          sVar13._M_str = pcStack_f0;
          JsonWriter::WriteBase64(writer,sVar13);
          goto LAB_002d0fbd;
        }
LAB_002d1183:
        absl::lts_20240722::internal_statusor::Helper::Crash(&local_100.status_);
LAB_002d118d:
        uVar10 = absl::lts_20240722::internal_statusor::Helper::Crash(&local_100.status_);
        absl::lts_20240722::internal_statusor::StatusOrData<int>::~StatusOrData
                  ((StatusOrData<int> *)&local_100.status_);
        _Unwind_Resume(uVar10);
      case 0xe:
        UnparseProto3Type::GetEnumValue((UnparseProto3Type *)&local_100.status_,field,local_d0,idx);
        *(anon_union_8_1_1246618d_for_StatusOrData<int>_1 *)this = local_100;
        aVar7 = local_100;
        if (((ulong)local_100 & 1) == 0) {
          LOCK();
          *(int *)local_100 = *(int *)local_100 + 1;
          UNLOCK();
          aVar7.status_.rep_ = *(Status *)this;
        }
        if (aVar7 != (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) goto LAB_002d0f51;
        if (local_100 != (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) goto LAB_002d118d;
        WriteEnum<google::protobuf::json_internal::UnparseProto3Type>
                  (writer,field,(int32_t)local_f8,kUnquoted);
LAB_002d0f42:
        absl::lts_20240722::internal_statusor::StatusOrData<int>::~StatusOrData
                  ((StatusOrData<int> *)&local_100.status_);
LAB_002d1091:
        *(undefined8 *)this = 1;
        goto LAB_002d10c2;
      default:
        local_100 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x18;
        local_f8 = 5.64877e-39;
        uStack_f4 = 0;
        ppMVar1 = &local_98.parent_;
        lVar8 = absl::lts_20240722::numbers_internal::FastIntToBuffer(iVar2,(char *)ppMVar1);
        local_98.pool_ = (ResolverPool *)(lVar8 - (long)ppMVar1);
        local_98.raw_ = (Field *)ppMVar1;
        absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_c0,(AlphaNum *)&local_100.status_);
        absl::lts_20240722::InvalidArgumentError(this,local_c0._8_8_,local_c0._0_8_);
        puVar9 = local_c0 + 0x10;
        if ((undefined1 *)local_c0._0_8_ != puVar9) {
          operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
          puVar9 = extraout_RAX_07;
        }
      }
      if (*(long *)this != 1) {
        return (Status)puVar9;
      }
LAB_002d10c2:
      idx = idx + 1;
    } while (local_c0._32_8_ != idx);
    writer->indent_ = writer->indent_ + -1;
    if (!bVar4) {
      JsonWriter::NewLine(writer);
    }
  }
  io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"]",1);
  *(undefined8 *)this = 1;
  return (Status)extraout_RAX_11;
}

Assistant:

absl::Status WriteRepeated(JsonWriter& writer, const Msg<Traits>& msg,
                           Field<Traits> field) {
  writer.Write("[");
  writer.Push();

  size_t count = Traits::GetSize(field, msg);
  bool first = true;
  for (size_t i = 0; i < count; ++i) {
    if (ClassifyMessage(Traits::FieldTypeName(field)) == MessageType::kValue) {
      bool empty = false;
      RETURN_IF_ERROR(Traits::WithFieldType(
          field, [&](const Desc<Traits>& desc) -> absl::Status {
            auto inner = Traits::GetMessage(field, msg, i);
            RETURN_IF_ERROR(inner.status());
            empty = IsEmpty<Traits>(**inner, desc);
            return absl::OkStatus();
          }));

      // Empty google.protobuf.Values are silently discarded.
      if (empty) {
        continue;
      }
    }
    writer.WriteComma(first);
    writer.NewLine();
    RETURN_IF_ERROR(WriteSingular<Traits>(writer, field, msg, i));
  }

  writer.Pop();
  if (!first) {
    writer.NewLine();
  }
  writer.Write("]");
  return absl::OkStatus();
}